

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O2

ptrdiff_t lj_vmevent_prepare(lua_State *L,VMEvent ev)

{
  byte *pbVar1;
  uint uVar2;
  GCstr *key;
  cTValue *pcVar3;
  TValue *pTVar4;
  VMEvent key_00;
  GCtab *t;
  
  uVar2 = (L->glref).ptr32;
  key = lj_str_new(L,"_VMEVENTS",9);
  pcVar3 = lj_tab_getstr((GCtab *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x118),key);
  if ((pcVar3->field_2).it == 0xfffffff4) {
    key_00 = ev & 0xfffffff8;
    t = (GCtab *)(ulong)(pcVar3->u32).lo;
    if ((uint)key_00 < t->asize) {
      pcVar3 = (cTValue *)((ulong)(t->array).ptr32 + (long)key_00 * 8);
    }
    else {
      pcVar3 = lj_tab_getinth(t,key_00);
    }
    if ((pcVar3 != (cTValue *)0x0) && ((pcVar3->field_2).it == 0xfffffff7)) {
      pTVar4 = L->top;
      if ((long)((ulong)(L->maxstack).ptr32 - (long)pTVar4) < 0xa1) {
        lj_state_growstack(L,0x14);
        pTVar4 = L->top;
      }
      L->top = pTVar4 + 1;
      (pTVar4->field_2).field_0 = (pcVar3->field_2).field_0;
      (pTVar4->field_2).it = 0xfffffff7;
      return (long)L->top - (ulong)(L->stack).ptr32;
    }
  }
  pbVar1 = (byte *)((ulong)uVar2 + 0x10b);
  *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)ev & 7));
  return 0;
}

Assistant:

ptrdiff_t lj_vmevent_prepare(lua_State *L, VMEvent ev)
{
  global_State *g = G(L);
  GCstr *s = lj_str_newlit(L, LJ_VMEVENTS_REGKEY);
  cTValue *tv = lj_tab_getstr(tabV(registry(L)), s);
  if (tvistab(tv)) {
    int hash = VMEVENT_HASH(ev);
    tv = lj_tab_getint(tabV(tv), hash);
    if (tv && tvisfunc(tv)) {
      lj_state_checkstack(L, LUA_MINSTACK);
      setfuncV(L, L->top++, funcV(tv));
      if (LJ_FR2) setnilV(L->top++);
      return savestack(L, L->top);
    }
  }
  g->vmevmask &= ~VMEVENT_MASK(ev);  /* No handler: cache this fact. */
  return 0;
}